

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<Clasp::OutputTable::PredType>(PredType *first,PredType *last,PredType *x)

{
  PredType *this;
  long in_RSI;
  long in_RDI;
  PredType *in_stack_ffffffffffffffd8;
  int local_10;
  long local_8;
  
  local_10 = (int)in_RSI;
  local_8._0_4_ = (int)in_RDI;
  this = (PredType *)(ulong)((uint)(local_10 - (int)local_8) >> 4 & 7);
  local_8 = in_RDI;
  switch(this) {
  case (PredType *)0x0:
    while (local_8 != in_RSI) {
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_7:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_6:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_5:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_4:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_3:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_2:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
switchD_001dcaa6_caseD_1:
      local_8 = local_8 + 0x10;
      Clasp::OutputTable::PredType::PredType(this,in_stack_ffffffffffffffd8);
    }
    break;
  case (PredType *)0x1:
    goto switchD_001dcaa6_caseD_1;
  case (PredType *)0x2:
    goto switchD_001dcaa6_caseD_2;
  case (PredType *)0x3:
    goto switchD_001dcaa6_caseD_3;
  case (PredType *)0x4:
    goto switchD_001dcaa6_caseD_4;
  case (PredType *)0x5:
    goto switchD_001dcaa6_caseD_5;
  case (PredType *)0x6:
    goto switchD_001dcaa6_caseD_6;
  case (PredType *)0x7:
    goto switchD_001dcaa6_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}